

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::increment(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
            *this)

{
  outer_range_iterator oVar1;
  iterator_range<std::_List_iterator<char>_> *piVar2;
  
  piVar2 = (this->m_begin)._M_current;
  oVar1 = semiintersection_end(this);
  for (; piVar2 != oVar1._M_current; piVar2 = piVar2 + 1) {
    (piVar2->
    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
    ).
    super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin._M_node =
         ((piVar2->
          super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::bidirectional_traversal_tag>
          ).
          super_iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_node)->_M_next;
  }
  settle(this);
  return;
}

Assistant:

void increment ()
        {
            std::for_each(m_begin, semiintersection_end(),
                [] (auto & range)
                {
                    range.advance_begin(1);
                });

            settle();
        }